

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void crec_copy_emit(jit_State *J,CRecMemList *ml,MSize mlp,TRef trdst,TRef trsrc)

{
  TRef TVar1;
  TRef TVar2;
  TRef trdptr;
  TRef trsptr;
  TRef trofs;
  MSize rwin;
  MSize j;
  MSize i;
  TRef trsrc_local;
  TRef trdst_local;
  MSize mlp_local;
  CRecMemList *ml_local;
  jit_State *J_local;
  
  trsptr = 0;
  rwin = 0;
  trofs = 0;
  while (rwin < mlp) {
    TVar1 = lj_ir_kint64(J,(ulong)ml[rwin].ofs);
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = (IRRef1)trsrc;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
    TVar2 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = (ushort)ml[rwin].tp | 0x4600;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = 0;
    TVar2 = lj_opt_fold(J);
    ml[rwin].trval = TVar2;
    ml[rwin].trofs = TVar1;
    rwin = rwin + 1;
    trsptr = trsptr + 1;
    if ((3 < trsptr) || (mlp <= rwin)) {
      trsptr = 0;
      for (; trofs < rwin; trofs = trofs + 1) {
        TVar1 = ml[trofs].trofs;
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = (IRRef1)trdst;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
        TVar2 = lj_opt_fold(J);
        TVar1 = ml[trofs].trval;
        (J->fold).ins.field_0.ot = (ushort)ml[trofs].tp | 0x4e00;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
        lj_opt_fold(J);
      }
    }
  }
  return;
}

Assistant:

static void crec_copy_emit(jit_State *J, CRecMemList *ml, MSize mlp,
			   TRef trdst, TRef trsrc)
{
  MSize i, j, rwin = 0;
  for (i = 0, j = 0; i < mlp; ) {
    TRef trofs = lj_ir_kintp(J, ml[i].ofs);
    TRef trsptr = emitir(IRT(IR_ADD, IRT_PTR), trsrc, trofs);
    ml[i].trval = emitir(IRT(IR_XLOAD, ml[i].tp), trsptr, 0);
    ml[i].trofs = trofs;
    i++;
    rwin += (LJ_SOFTFP32 && ml[i].tp == IRT_NUM) ? 2 : 1;
    if (rwin >= CREC_COPY_REGWIN || i >= mlp) {  /* Flush buffered stores. */
      rwin = 0;
      for ( ; j < i; j++) {
	TRef trdptr = emitir(IRT(IR_ADD, IRT_PTR), trdst, ml[j].trofs);
	emitir(IRT(IR_XSTORE, ml[j].tp), trdptr, ml[j].trval);
      }
    }
  }
}